

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Abc_Ntk_t *pNtk;
  FILE *__stream;
  Abc_Cex_t *pAVar8;
  Abc_Obj_t *pObj;
  char *pcVar9;
  int nCexes;
  Vec_Int_t *p;
  char *pcVar10;
  size_t sStack_50;
  char *local_40;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_40 = (char *)0x0;
  Extra_UtilGetoptReset();
  bVar2 = true;
  bVar1 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"Losh"), iVar3 == 0x6f) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x73) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else {
      if (iVar3 != 0x4c) goto LAB_0021ea94;
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
LAB_0021ea94:
        iVar3 = -2;
        Abc_Print(-2,"usage: print_status [-L file] [-osh]\n");
        Abc_Print(-2,"\t          prints verification status\n");
        pcVar9 = "no logging";
        if (local_40 != (char *)0x0) {
          pcVar9 = local_40;
        }
        Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",pcVar9);
        pcVar10 = "yes";
        pcVar9 = "yes";
        if (!bVar1) {
          pcVar9 = "no";
        }
        Abc_Print(-2,"\t-o      : toggle printing output status [default = %s]\n",pcVar9);
        if (!bVar2) {
          pcVar10 = "no";
        }
        Abc_Print(-2,"\t-s      : toggle using short print-out [default = %s]\n",pcVar10);
        pcVar9 = "\t-h      : print the command usage\n";
LAB_0021eb27:
        Abc_Print(iVar3,pcVar9);
        return 1;
      }
      local_40 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
  }
  if (bVar1) {
    if (pNtk != (Abc_Ntk_t *)0x0) {
      Abc_NtkPrintPoEquivs(pNtk);
      return 0;
    }
    pcVar9 = "Empty network.\n";
    iVar3 = -1;
    goto LAB_0021eb27;
  }
  if (pAbc->vStatuses == (Vec_Int_t *)0x0) {
    Abc_Print(1,"Status = %d  Frames = %d   ",(ulong)(uint)pAbc->Status,(ulong)(uint)pAbc->nFrames);
  }
  if (pAbc->pCex == (Abc_Cex_t *)0x0) {
    if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) {
      Abc_Print(1,"Cex is not defined.\n");
      goto LAB_0021e8ec;
    }
  }
  else {
    Abc_CexPrintStats(pAbc->pCex);
    if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) goto LAB_0021e8ec;
  }
  for (iVar3 = 0; iVar3 < pAbc->vCexVec->nSize; iVar3 = iVar3 + 1) {
    pAVar8 = (Abc_Cex_t *)Vec_PtrEntry(pAbc->vCexVec,iVar3);
    if ((Abc_Cex_t *)0x1 < pAVar8) {
      printf("%4d : ");
      Abc_CexPrintStats(pAVar8);
    }
  }
LAB_0021e8ec:
  p = pAbc->vStatuses;
  if (p == (Vec_Int_t *)0x0) {
    return 0;
  }
  if (local_40 == (char *)0x0) {
    if (bVar2) {
      uVar5 = Vec_IntCountEntry(p,0);
      uVar6 = Vec_IntCountEntry(p,1);
      uVar7 = Vec_IntCountEntry(p,-1);
      printf("Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",
             (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)(uint)p->nSize);
    }
    else {
      for (uVar5 = 0; (int)uVar5 < p->nSize; uVar5 = uVar5 + 1) {
        uVar6 = Vec_IntEntry(p,uVar5);
        printf("%d=%d  ",(ulong)uVar5,(ulong)uVar6);
        p = pAbc->vStatuses;
      }
    }
LAB_0021ea2a:
    putchar(10);
    return 0;
  }
  __stream = fopen(local_40,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",local_40);
    return 0;
  }
  iVar3 = 0;
  do {
    if (pAbc->vCexVec->nSize <= iVar3) {
      fclose(__stream);
      goto LAB_0021ea2a;
    }
    pAVar8 = (Abc_Cex_t *)Vec_PtrEntry(pAbc->vCexVec,iVar3);
    iVar4 = Vec_IntEntry(pAbc->vStatuses,iVar3);
    if (iVar4 == 1) {
      pcVar9 = "STATUS: UNSAT ";
      sStack_50 = 0xe;
LAB_0021e988:
      fwrite(pcVar9,sStack_50,1,__stream);
    }
    else {
      if (iVar4 == 0) {
        pcVar9 = "STATUS: SAT ";
        sStack_50 = 0xc;
        goto LAB_0021e988;
      }
      if (iVar4 == -1) {
        pcVar9 = "STATUS: ABORTED ";
        sStack_50 = 0x10;
        goto LAB_0021e988;
      }
    }
    pObj = Abc_NtkPo(pNtk,iVar3);
    pcVar9 = Abc_ObjName(pObj);
    fprintf(__stream,"%s\n",pcVar9);
    if (iVar4 == 0) {
      Abc_NtkDumpOneCexSpecial((FILE *)__stream,pNtk,pAVar8);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int Abc_CommandPrintStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDumpOneCexSpecial( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex );
    extern void Abc_NtkPrintPoEquivs( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fOutStatus = 0, fShort = 1;
    char * pLogFileName = NULL;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Losh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'o':
            fOutStatus ^= 1;
            break;
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fOutStatus )
    {
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Empty network.\n" );
            return 1;
        }
        Abc_NtkPrintPoEquivs( pNtk );
        return 0;
    }
    if ( !pAbc->vStatuses )
        Abc_Print( 1,"Status = %d  Frames = %d   ", pAbc->Status, pAbc->nFrames );
    if ( pAbc->pCex == NULL && pAbc->vCexVec == NULL )
        Abc_Print( 1,"Cex is not defined.\n" );
    else
    {
        if ( pAbc->pCex )
            Abc_CexPrintStats( pAbc->pCex );
        if ( pAbc->vCexVec )
        {
            Abc_Cex_t * pTemp;
            int nCexes = 0;
            int Counter = 0;
            //printf( "\n" );
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                if ( pTemp == (void *)(ABC_PTRINT_T)1 )
                {
                    Counter++;
                    continue;
                }
                if ( pTemp )
                {
                    printf( "%4d : ", ++nCexes );
                    Abc_CexPrintStats( pTemp );
                }
            }
//            if ( Counter )
//                printf( "In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n", Counter, Vec_PtrSize(pAbc->vCexVec) );
        }
    }
    if ( pAbc->vStatuses )
    {
        if ( pLogFileName )
        {
            Abc_Cex_t * pTemp = NULL;
            FILE * pFile = fopen( pLogFileName, "wb" );
            if ( pFile == NULL )
            {
                printf( "Cannot open file \"%s\" for writing.\n", pLogFileName );
                return 0;
            }
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                int Status = Vec_IntEntry( pAbc->vStatuses, c );
                if ( Status == -1 ) // undec
                    fprintf( pFile, "STATUS: ABORTED " );
                else if ( Status == 0 )
                    fprintf( pFile, "STATUS: SAT " );
                else if ( Status == 1 )
                    fprintf( pFile, "STATUS: UNSAT " );
                fprintf( pFile, "%s\n", Abc_ObjName(Abc_NtkPo(pNtk, c)) );
                if ( Status != 0 )
                    continue;
                Abc_NtkDumpOneCexSpecial( pFile, pNtk, pTemp );
            }
            fclose( pFile );
        }
        else if ( fShort )
        {
            printf( "Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",
                Vec_IntCountEntry(pAbc->vStatuses, 0), Vec_IntCountEntry(pAbc->vStatuses, 1),
                Vec_IntCountEntry(pAbc->vStatuses, -1), Vec_IntSize(pAbc->vStatuses) );
        }
        else
        {
            int i, Entry;
            Vec_IntForEachEntry( pAbc->vStatuses, Entry, i )
                printf( "%d=%d  ", i, Entry );
        }
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_status [-L file] [-osh]\n" );
    Abc_Print( -2, "\t          prints verification status\n" );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n",  pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-o      : toggle printing output status [default = %s]\n", fOutStatus? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle using short print-out [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}